

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

void __thiscall
cppcms::impl::details::basic_map<$7159f324$>::rehash(basic_map<_7159f324_> *this,size_t new_size)

{
  container *pcVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  container *pcVar5;
  range_type *prVar6;
  iterator p;
  basic_map<_7159f324_> local_78;
  value_type local_48;
  
  local_78.list_.end = (container *)0x0;
  local_78.size_ = 0;
  local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  local_78.list_.begin = (container *)0x0;
  local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.first = (container *)0x0;
  local_48.second = (container *)0x0;
  std::vector<$28565068$>::resize(&local_78.hash_,new_size,&local_48);
  while (pcVar5 = local_78.list_.begin, pcVar1 = (this->list_).begin, pcVar1 != (container *)0x0) {
    intrusive_list<$b487a5d2$>::erase(&this->list_,pcVar1);
    prVar6 = basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
             ::get<std::__cxx11::string>
                       ((basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
                         *)&local_78,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar1)
    ;
    if (prVar6->first == (container *)0x0) {
      pcVar1->next = (container *)0x0;
      pcVar1->prev = local_78.list_.end;
      if (local_78.list_.end != (container *)0x0) {
        (local_78.list_.end)->next = pcVar1;
      }
      if (local_78.list_.begin == (container *)0x0) {
        local_78.list_.begin = pcVar1;
      }
      prVar6->second = pcVar1;
      local_78.list_.end = pcVar1;
    }
    else {
      intrusive_list<$b487a5d2$>::insert_after(&local_78.list_,pcVar1,prVar6->second);
      prVar6 = (range_type *)&prVar6->second;
    }
    prVar6->first = pcVar1;
  }
  pcVar1 = (this->list_).end;
  (this->list_).end = local_78.list_.end;
  ppVar2 = (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start =
       local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start;
  (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish =
       local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish;
  local_78.list_.begin = (container *)0x0;
  (this->hash_).super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (this->list_).begin = pcVar5;
  local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  if (ppVar3 != ppVar2) {
    local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_finish = ppVar2
    ;
  }
  local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_start = ppVar2;
  local_78.hash_.super__Vector_base<_28565068_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       ppVar4;
  local_78.list_.end = pcVar1;
  ~basic_map(&local_78);
  return;
}

Assistant:

void rehash(size_t new_size)
	{
		basic_map tmp;
		tmp.hash_.resize(new_size,range_type(iterator(),iterator()));
		while(list_.begin) {
			iterator p=list_.begin;
			list_.erase(p);
			range_type &r = tmp.get(p->val.first);
			if(r.first == 0) {
				tmp.list_.push_back(p);
				r.first = r.second = p;
			}
			else {
				tmp.list_.insert_after(p,r.second);
				r.second = p;
			}
		}
		list_.swap(tmp.list_);
		hash_.swap(tmp.hash_);
		tmp.hash_.clear();
	}